

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9ParseIniString(jx9_context *pCtx,char *zIn,sxu32 nByte,int bProcessSection)

{
  SyBlob *pBlob;
  char cVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  jx9_value *pValue;
  jx9_value *pVal;
  jx9_value *pVal_00;
  ushort **ppuVar6;
  SyHashEntry *pSVar7;
  jx9_value *pjVar8;
  jx9_value *pjVar9;
  bool bVar10;
  undefined4 in_register_0000000c;
  undefined8 uVar11;
  undefined8 extraout_RDX;
  uint uVar12;
  char *pcVar13;
  int iVar14;
  sxu32 nKeyLen;
  ulong uVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  long lVar19;
  ulong uVar20;
  char *pcVar21;
  ulong uVar22;
  long lVar23;
  jx9_value *local_a0;
  char *local_90;
  SyHash sHash;
  
  uVar11 = CONCAT44(in_register_0000000c,bProcessSection);
  pValue = jx9_context_new_array(pCtx);
  pVal = jx9_context_new_scalar(pCtx);
  pVal_00 = jx9_context_new_scalar(pCtx);
  bVar10 = pVal == (jx9_value *)0x0 || pValue == (jx9_value *)0x0;
  if (pVal_00 == (jx9_value *)0x0 || (pVal == (jx9_value *)0x0 || pValue == (jx9_value *)0x0)) {
    jx9_context_throw_error(pCtx,1,"JX9 is running out of memory");
    iVar4 = jx9_result_bool(pCtx,0);
    return iVar4;
  }
  pcVar16 = zIn + nByte;
  SyHashInit(&sHash,&pCtx->pVm->sAllocator,
             (ProcHash)
             CONCAT71((int7)((ulong)extraout_RDX >> 8),pVal_00 == (jx9_value *)0x0 || bVar10),
             (ProcCmp)CONCAT71((int7)((ulong)uVar11 >> 8),bVar10));
  pBlob = &pVal->sBlob;
  local_a0 = pValue;
LAB_00130a2a:
  do {
    while( true ) {
      if (pcVar16 <= zIn) {
        SyHashRelease(&sHash);
        iVar4 = jx9_result_value(pCtx,pValue);
        return iVar4;
      }
      cVar1 = *zIn;
      if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
         (ppuVar6 = __ctype_b_loc(), (*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) == 0))
      break;
      zIn = zIn + 1;
    }
    if ((cVar1 != ';') && (cVar1 != '#')) {
      SyBlobReset(pBlob);
      if (*zIn == '[') {
        pcVar17 = zIn + 1;
        uVar5 = 0;
        for (uVar20 = 0; (pcVar17 + uVar20 < pcVar16 && (pcVar17[uVar20] != ']'));
            uVar20 = uVar20 + 1) {
          uVar5 = uVar5 + 1;
        }
        if (1 < uVar20 + 1 && bProcessSection != 0) {
          uVar15 = (ulong)uVar5;
          pcVar21 = zIn;
          do {
            uVar22 = uVar15;
            pcVar13 = zIn + (uVar20 & 0xffffffff) + 1;
            if (((int)uVar22 == 0) ||
               (cVar1 = *pcVar17, pcVar13 = pcVar17, 0xffffffffffffffbf < (ulong)(long)cVar1))
            break;
            pcVar13 = pcVar21 + 1;
            ppuVar6 = __ctype_b_loc();
            pcVar17 = pcVar17 + 1;
            uVar15 = uVar22 - 1;
            pcVar21 = pcVar13;
          } while ((*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) != 0);
          do {
            uVar15 = uVar22;
            if (uVar15 == 0) {
              jx9_value_string(pVal,pcVar13,0);
              goto LAB_00130feb;
            }
            cVar1 = pcVar13[uVar15 - 1];
          } while (((ulong)(long)cVar1 < 0xffffffffffffffc0) &&
                  (ppuVar6 = __ctype_b_loc(), uVar22 = uVar15 - 1,
                  (*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) != 0));
          jx9_value_string(pVal,pcVar13,(int)uVar15);
          pjVar9 = jx9_context_new_array(pCtx);
          if (pjVar9 != (jx9_value *)0x0) {
            jx9_array_add_elem(pValue,pVal,pjVar9);
            local_a0 = pjVar9;
          }
        }
LAB_00130feb:
        zIn = zIn + uVar20 + 2;
      }
      else {
        bVar10 = false;
        uVar20 = 0;
        pjVar9 = local_a0;
        for (pcVar17 = zIn; (pcVar17 < pcVar16 && (*pcVar17 != '=')); pcVar17 = pcVar17 + 1) {
          if (!bVar10 && *pcVar17 == '[') {
            uVar20 = (long)pcVar17 - (long)zIn;
            if (0 < (int)(uint)uVar20) {
              uVar15 = uVar20 & 0xffffffff;
              pcVar21 = zIn;
              while (((iVar4 = (int)uVar15, pcVar13 = zIn + ((uint)uVar20 & 0x7fffffff), iVar4 != 0
                      && (cVar1 = *pcVar21, pcVar13 = pcVar21,
                         (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
                     (ppuVar6 = __ctype_b_loc(),
                     (*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
                pcVar21 = pcVar21 + 1;
                uVar15 = uVar15 - 1;
              }
              uVar22 = 0;
              pcVar21 = pcVar13;
              do {
                pcVar21 = pcVar21 + -1;
                if (uVar15 == uVar22) {
                  nKeyLen = 0;
                  goto LAB_00130b64;
                }
                cVar1 = pcVar21[uVar15];
                if (0xffffffffffffffbf < (ulong)(long)cVar1) {
                  nKeyLen = iVar4 - (int)uVar22;
                  goto LAB_00130b64;
                }
                ppuVar6 = __ctype_b_loc();
                uVar22 = uVar22 + 1;
              } while ((*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) != 0);
              nKeyLen = (iVar4 - (int)uVar22) + 1;
LAB_00130b64:
              pSVar7 = SyHashGet(&sHash,pcVar13,nKeyLen);
              if (pSVar7 == (SyHashEntry *)0x0) {
                pjVar8 = jx9_context_new_array(pCtx);
                if (pjVar8 == (jx9_value *)0x0) {
                  pjVar8 = (jx9_value *)0x0;
                }
                else {
                  SyHashInsert(&sHash,pcVar13,nKeyLen,pjVar8);
                  SyBlobReset(pBlob);
                  jx9_value_string(pVal,pcVar13,nKeyLen);
                  jx9_array_add_elem(pjVar9,pVal,pjVar8);
                  SyBlobReset(pBlob);
                }
              }
              else {
                pjVar8 = (jx9_value *)pSVar7->pUserData;
              }
              if (pjVar8 != (jx9_value *)0x0) {
                pjVar9 = pjVar8;
              }
            }
            for (; (pcVar17 < pcVar16 && (*pcVar17 != ']')); pcVar17 = pcVar17 + 1) {
            }
            bVar10 = true;
          }
        }
        uVar5 = (uint)pcVar17;
        uVar20 = uVar20 & 0xffffffff;
        if (!bVar10) {
          uVar20 = (ulong)(uVar5 - (int)zIn);
        }
        pcVar21 = zIn + uVar20;
        while (((pcVar13 = pcVar21, (int)uVar20 != 0 &&
                (cVar1 = *zIn, pcVar13 = zIn, (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
               (ppuVar6 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) != 0))) {
          zIn = zIn + 1;
          uVar20 = uVar20 - 1;
        }
        do {
          uVar15 = uVar20;
          zIn = pcVar17;
          if (uVar15 == 0) goto LAB_00130d52;
          cVar1 = pcVar13[uVar15 - 1];
        } while (((ulong)(long)cVar1 < 0xffffffffffffffc0) &&
                (ppuVar6 = __ctype_b_loc(), uVar20 = uVar15 - 1,
                (*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) != 0));
        if (!bVar10) {
          jx9_value_string(pVal,pcVar13,(int)uVar15);
        }
        SyBlobReset(&pVal_00->sBlob);
        pcVar21 = pcVar17 + 3;
        iVar4 = -uVar5;
        uVar5 = ~uVar5;
        do {
          uVar12 = uVar5;
          iVar14 = iVar4;
          pcVar18 = pcVar17;
          pcVar13 = pcVar21;
          zIn = zIn + 1;
          if (pcVar16 <= zIn) goto LAB_00130a2a;
          cVar1 = *zIn;
          if (0xffffffffffffffbf < (ulong)(long)cVar1) break;
          ppuVar6 = __ctype_b_loc();
          pcVar21 = pcVar13 + 1;
          pcVar17 = pcVar18 + 1;
          iVar4 = iVar14 + -1;
          uVar5 = uVar12 - 1;
        } while ((*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) != 0);
        if ((cVar1 == '\"') || (pcVar17 = zIn, cVar1 == '\'')) {
          for (; (pcVar21 = pcVar13 + -1, pcVar21 < pcVar16 &&
                 ((*pcVar21 != cVar1 || (pcVar13[-2] == '\\')))); pcVar13 = pcVar13 + 1) {
          }
          pcVar17 = pcVar13;
          if (pcVar16 <= pcVar21) {
            pcVar17 = pcVar21;
          }
        }
        else {
          for (; pcVar17 < pcVar16; pcVar17 = pcVar17 + 1) {
            cVar2 = *pcVar17;
            if (cVar2 == '\n') {
              if (pcVar17[-1] != '\\') break;
            }
            else if ((cVar2 == '#') || (cVar2 == ';')) break;
          }
        }
        uVar12 = uVar12 + (int)pcVar17;
        iVar4 = 0;
        lVar23 = 0;
        local_90 = pcVar18;
        while (((uVar12 != (uint)lVar23 &&
                (cVar2 = zIn[lVar23], (ulong)(long)cVar2 < 0xffffffffffffffc0)) &&
               (ppuVar6 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar6 + (long)cVar2 * 2 + 1) & 0x20) != 0))) {
          lVar23 = lVar23 + 1;
          iVar4 = iVar4 + 1;
          local_90 = local_90 + 1;
        }
        pcVar21 = zIn + lVar23;
        lVar19 = 0;
        do {
          if (lVar23 - (ulong)uVar12 == lVar19) {
            uVar12 = 0;
            goto LAB_00130e64;
          }
          cVar2 = pcVar18[lVar19 + (ulong)uVar12];
          if (0xffffffffffffffbf < (ulong)(long)cVar2) {
            uVar12 = uVar12 - iVar4;
            goto LAB_00130e64;
          }
          ppuVar6 = __ctype_b_loc();
          iVar4 = iVar4 + 1;
          lVar19 = lVar19 + -1;
        } while ((*(byte *)((long)*ppuVar6 + (long)cVar2 * 2 + 1) & 0x20) != 0);
        uVar12 = (iVar14 + (int)pcVar17) - iVar4;
LAB_00130e64:
        if ((cVar1 == '\'') || (cVar1 == '\"')) {
          uVar20 = (ulong)uVar12;
          for (; ((int)uVar20 != 0 && (*pcVar21 == cVar1)); pcVar21 = pcVar21 + 1) {
            uVar20 = uVar20 - 1;
          }
          lVar23 = 1;
          do {
            if (uVar20 + lVar23 == 1) goto LAB_00130ecb;
            lVar19 = lVar23 + -1;
            lVar3 = lVar23 + ((ulong)uVar12 - 1);
            lVar23 = lVar19;
          } while (local_90[lVar3] == cVar1);
          uVar12 = (int)uVar20 + (int)lVar19;
LAB_00130ebe:
          jx9_value_string(pVal_00,pcVar21,uVar12);
        }
        else if (uVar12 != 0) goto LAB_00130ebe;
LAB_00130ecb:
        pjVar8 = (jx9_value *)0x0;
        if (!bVar10) {
          pjVar8 = pVal;
        }
        jx9_array_add_elem(pjVar9,pjVar8,pVal_00);
        zIn = pcVar17;
      }
      goto LAB_00130a2a;
    }
    do {
      zIn = zIn + 1;
      if (pcVar16 <= zIn) break;
    } while (*zIn != '\n');
  } while( true );
LAB_00130d52:
  if (pcVar16 <= zIn) goto LAB_00130a2a;
  cVar1 = *zIn;
  if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
     ((ppuVar6 = __ctype_b_loc(), cVar1 != '=' && (((*ppuVar6)[cVar1] & 0x2000) == 0))))
  goto LAB_00130a2a;
  zIn = zIn + 1;
  goto LAB_00130d52;
}

Assistant:

JX9_PRIVATE sxi32 jx9ParseIniString(jx9_context *pCtx, const char *zIn, sxu32 nByte, int bProcessSection)
{
	jx9_value *pCur, *pArray, *pSection, *pWorker, *pValue;
	const char *zCur, *zEnd = &zIn[nByte];
	SyHashEntry *pEntry;
	SyString sEntry;
	SyHash sHash;
	int c;
	/* Create an empty array and worker variables */
	pArray = jx9_context_new_array(pCtx);
	pWorker = jx9_context_new_scalar(pCtx);
	pValue = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pWorker == 0 || pValue == 0){
		/* Out of memory */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		/* Return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	SyHashInit(&sHash, &pCtx->pVm->sAllocator, 0, 0);
	pCur = pArray;
	/* Start the parse process */
	for(;;){
		/* Ignore leading white spaces */
		while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && SyisSpace(zIn[0])){
			zIn++;
		}
		if( zIn >= zEnd ){
			/* No more input to process */
			break;
		}
		if( zIn[0] == ';' || zIn[0] == '#' ){
			/* Comment til the end of line */
			zIn++;
			while(zIn < zEnd && zIn[0] != '\n' ){
				zIn++;
			}
			continue;
		}
		/* Reset the string cursor of the working variable */
		jx9_value_reset_string_cursor(pWorker);
		if( zIn[0] == '[' ){
			/* Section: Extract the section name */
			zIn++;
			zCur = zIn;
			while( zIn < zEnd && zIn[0] != ']' ){
				zIn++;
			}
			if( zIn > zCur && bProcessSection ){
				/* Save the section name */
				SyStringInitFromBuf(&sEntry, zCur, (int)(zIn-zCur));
				SyStringFullTrim(&sEntry);
				jx9_value_string(pWorker, sEntry.zString, (int)sEntry.nByte);
				if( sEntry.nByte > 0 ){
					/* Associate an array with the section */
					pSection = jx9_context_new_array(pCtx);
					if( pSection ){
						jx9_array_add_elem(pArray, pWorker/*Section name*/, pSection);
						pCur = pSection;
					}
				}
			}
			zIn++; /* Trailing square brackets ']' */
		}else{
			jx9_value *pOldCur;
			int is_array;
			int iLen;
			/* Properties */
			is_array = 0;
			zCur = zIn;
			iLen = 0; /* cc warning */
			pOldCur = pCur;
			while( zIn < zEnd && zIn[0] != '=' ){
				if( zIn[0] == '[' && !is_array ){
					/* Array */
					iLen = (int)(zIn-zCur);
					is_array = 1;
					if( iLen > 0 ){
						jx9_value *pvArr = 0; /* cc warning */
						/* Query the hashtable */
						SyStringInitFromBuf(&sEntry, zCur, iLen);
						SyStringFullTrim(&sEntry);
						pEntry = SyHashGet(&sHash, (const void *)sEntry.zString, sEntry.nByte);
						if( pEntry ){
							pvArr = (jx9_value *)SyHashEntryGetUserData(pEntry);
						}else{
							/* Create an empty array */
							pvArr = jx9_context_new_array(pCtx);
							if( pvArr ){
								/* Save the entry */
								SyHashInsert(&sHash, (const void *)sEntry.zString, sEntry.nByte, pvArr);
								/* Insert the entry */
								jx9_value_reset_string_cursor(pWorker);
								jx9_value_string(pWorker, sEntry.zString, (int)sEntry.nByte);
								jx9_array_add_elem(pCur, pWorker, pvArr);
								jx9_value_reset_string_cursor(pWorker);
							}
						}
						if( pvArr ){
							pCur = pvArr;
						}
					}
					while ( zIn < zEnd && zIn[0] != ']' ){
						zIn++;
					}
				}
				zIn++;
			}
			if( !is_array ){
				iLen = (int)(zIn-zCur);
			}
			/* Trim the key */
			SyStringInitFromBuf(&sEntry, zCur, iLen);
			SyStringFullTrim(&sEntry);
			if( sEntry.nByte > 0 ){
				if( !is_array ){
					/* Save the key name */
					jx9_value_string(pWorker, sEntry.zString, (int)sEntry.nByte);
				}
				/* extract key value */
				jx9_value_reset_string_cursor(pValue);
				zIn++; /* '=' */
				while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && SyisSpace(zIn[0]) ){
					zIn++;
				}
				if( zIn < zEnd ){
					zCur = zIn;
					c = zIn[0];
					if( c == '"' || c == '\'' ){
						zIn++;
						/* Delimit the value */
						while( zIn < zEnd ){
							if ( zIn[0] == c && zIn[-1] != '\\' ){
								break;
							}
							zIn++;
						}
						if( zIn < zEnd ){
							zIn++;
						}
					}else{
						while( zIn < zEnd ){
							if( zIn[0] == '\n' ){
								if( zIn[-1] != '\\' ){
									break;
								}
							}else if( zIn[0] == ';' || zIn[0] == '#' ){
								/* Inline comments */
								break;
							}
							zIn++;
						}
					}
					/* Trim the value */
					SyStringInitFromBuf(&sEntry, zCur, (int)(zIn-zCur));
					SyStringFullTrim(&sEntry);
					if( c == '"' || c == '\'' ){
						SyStringTrimLeadingChar(&sEntry, c);
						SyStringTrimTrailingChar(&sEntry, c);
					}
					if( sEntry.nByte > 0 ){
						jx9_value_string(pValue, sEntry.zString, (int)sEntry.nByte);
					}
					/* Insert the key and it's value */
					jx9_array_add_elem(pCur, is_array ? 0 /*Automatic index assign */: pWorker, pValue);
				}
			}else{
				while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && ( SyisSpace(zIn[0]) || zIn[0] == '=' ) ){
					zIn++;
				}
			}
			pCur = pOldCur;
		}
	}
	SyHashRelease(&sHash);
	/* Return the parse of the INI string */
	jx9_result_value(pCtx, pArray);
	return SXRET_OK;
}